

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinetic.c
# Opt level: O2

void kinlist(Symbol *fun,Rlist *rlst)

{
  Symbol *s;
  char *__format;
  long lVar1;
  
  if (rlst->slist_decl != 0) {
    return;
  }
  rlst->slist_decl = 1;
  for (lVar1 = 0; lVar1 < rlst->nsym; lVar1 = lVar1 + 1) {
    s = rlst->symorder[lVar1];
    slist_data(s,s->varnum,(fun->u).i);
    if ((s->subtype & 0x20) == 0) {
      sprintf(buf,"_slist%d[%d] = &(%s) - _p;",(ulong)(uint)(fun->u).i,(ulong)(uint)s->varnum,
              s->name);
      __format = " _dlist%d[%d] = &(D%s) - _p;\n";
    }
    else {
      sprintf(buf,"for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;",(ulong)(uint)s->araydim,
              (ulong)(uint)(fun->u).i,(ulong)(uint)s->varnum,s->name);
      __format = " _dlist%d[%d+_i] = (D%s + _i) - _p;}\n";
    }
    lappendstr(initlist,buf);
    sprintf(buf,__format,(ulong)(uint)(fun->u).i,(ulong)(uint)s->varnum,s->name);
    lappendstr(initlist,buf);
    s->used = 0;
  }
  return;
}

Assistant:

static void kinlist(fun, rlst)
	Symbol *fun;
	Rlist *rlst;
{
	int i, count;
	Symbol *s;
	Item* qv;
	
	if (rlst->slist_decl) {
		return;
	}
	rlst->slist_decl = 1;
	/* put slist and dlist in initlist */

	count = 0;
	for (i=0; i < rlst->nsym; i++) {
		s = rlst->symorder[i];
		if (s->subtype & ARRAY) { int dim = s->araydim;
			count += dim;
		}else{
			count++;
		}
	}
	for (i=0; i < rlst->nsym; i++) {
		s = rlst->symorder[i];
#if CVODE
		slist_data(s, s->varnum, fun->u.i);
#endif
if (s->subtype & ARRAY) { int dim = s->araydim;
	Sprintf(buf, "for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p;"
		,dim, fun->u.i , s->varnum, s->name);
	qv = lappendstr(initlist, buf);
#if 0 && VECTORIZE
if (vectorize){
	Sprintf(buf, "for(_i=0;_i<%d;_i++){_slist%d[%d+_i] = (%s + _i) - _p[_ix];"
		,dim, fun->u.i , s->varnum, s->name);
	vectorize_substitute(qv, buf);
}
#endif
	Sprintf(buf, " _dlist%d[%d+_i] = (D%s + _i) - _p;}\n"
		, fun->u.i, s->varnum, s->name);
	qv = lappendstr(initlist, buf);
#if 0 && VECTORIZE
if (vectorize){
	Sprintf(buf, " _dlist%d[%d+_i] = (D%s + _i) - _p[_ix];}\n"
		, fun->u.i, s->varnum, s->name);
	vectorize_substitute(qv, buf);
}
#endif
}else{
		Sprintf(buf, "_slist%d[%d] = &(%s) - _p;",
			fun->u.i, s->varnum, s->name);
		qv = lappendstr(initlist, buf);
#if 0 && VECTORIZE
if (vectorize){
		Sprintf(buf, "_slist%d[%d] = &(%s) - _p[_ix];",
			fun->u.i, s->varnum, s->name);
		vectorize_substitute(qv, buf);
}
#endif
		Sprintf(buf, " _dlist%d[%d] = &(D%s) - _p;\n",
			fun->u.i, s->varnum, s->name);
		qv = lappendstr(initlist, buf);
#if 0 && VECTORIZE
if (vectorize){
		Sprintf(buf, " _dlist%d[%d] = &(D%s) - _p[_ix];\n",
			fun->u.i, s->varnum, s->name);
		vectorize_substitute(qv, buf);
}
#endif
}
		s->used = 0;
	}
}